

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::asio_service_impl::timer_handler(asio_service_impl *this,error_code err)

{
  char cVar1;
  char cVar2;
  int *piVar3;
  char *pcVar4;
  long in_RDI;
  unique_lock<std::mutex> lock;
  uint8_t exp;
  memory_order __b;
  undefined2 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffeba;
  undefined1 in_stack_fffffffffffffebb;
  undefined1 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebd;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  undefined1 in_stack_fffffffffffffec0;
  char in_stack_fffffffffffffec1;
  undefined1 in_stack_fffffffffffffec2;
  char in_stack_fffffffffffffec3;
  undefined1 in_stack_fffffffffffffec4;
  char in_stack_fffffffffffffec5;
  undefined1 in_stack_fffffffffffffec6;
  char in_stack_fffffffffffffec7;
  undefined1 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffec9;
  undefined1 in_stack_fffffffffffffeca;
  undefined1 in_stack_fffffffffffffecb;
  undefined1 in_stack_fffffffffffffecc;
  undefined1 in_stack_fffffffffffffecd;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  duration *in_stack_fffffffffffffed8;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *in_stack_fffffffffffffee0;
  char *pcVar5;
  char local_b1 [9];
  code *local_a8;
  undefined8 local_a0;
  int local_7c;
  duration<long,std::ratio<3600l,1l>> local_78 [8];
  rep local_70;
  int local_4c;
  memory_order local_48;
  int local_44;
  int *local_40;
  undefined4 local_38;
  undefined1 local_31;
  char *local_30;
  char *local_28;
  bool local_1e;
  undefined1 local_1d;
  memory_order local_1c;
  undefined4 local_18;
  undefined1 local_11;
  char *local_10;
  char *local_8;
  
  piVar3 = (int *)(in_RDI + 0xb8);
  local_44 = 5;
  local_40 = piVar3;
  local_48 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_44 - 1U < 2) {
    local_4c = *piVar3;
  }
  else if (local_44 == 5) {
    local_4c = *piVar3;
  }
  else {
    local_4c = *piVar3;
  }
  if (local_4c == 1) {
    local_7c = 1000;
    std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_78,&local_7c);
    local_70 = (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<3600l,1l>>
                              ((duration<long,_std::ratio<3600L,_1L>_> *)
                               CONCAT17(in_stack_fffffffffffffebf,
                                        CONCAT16(in_stack_fffffffffffffebe,
                                                 CONCAT15(in_stack_fffffffffffffebd,
                                                          CONCAT14(in_stack_fffffffffffffebc,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffebb,
                                                  CONCAT12(in_stack_fffffffffffffeba,
                                                           in_stack_fffffffffffffeb8)))))));
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::expires_after(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_a8 = timer_handler;
    local_a0 = 0;
    std::
    bind<void(nuraft::asio_service_impl::*)(std::error_code),nuraft::asio_service_impl*,std::_Placeholder<1>const&>
              ((offset_in_asio_service_impl_to_subr *)
               CONCAT17(in_stack_fffffffffffffecf,
                        CONCAT16(in_stack_fffffffffffffece,
                                 CONCAT15(in_stack_fffffffffffffecd,
                                          CONCAT14(in_stack_fffffffffffffecc,
                                                   CONCAT13(in_stack_fffffffffffffecb,
                                                            CONCAT12(in_stack_fffffffffffffeca,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffec9,
                                                  in_stack_fffffffffffffec8))))))),
               (asio_service_impl **)
               CONCAT17(in_stack_fffffffffffffec7,
                        CONCAT16(in_stack_fffffffffffffec6,
                                 CONCAT15(in_stack_fffffffffffffec5,
                                          CONCAT14(in_stack_fffffffffffffec4,
                                                   CONCAT13(in_stack_fffffffffffffec3,
                                                            CONCAT12(in_stack_fffffffffffffec2,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
               (_Placeholder<1> *)
               CONCAT17(in_stack_fffffffffffffebf,
                        CONCAT16(in_stack_fffffffffffffebe,
                                 CONCAT15(in_stack_fffffffffffffebd,
                                          CONCAT14(in_stack_fffffffffffffebc,
                                                   CONCAT13(in_stack_fffffffffffffebb,
                                                            CONCAT12(in_stack_fffffffffffffeba,
                                                                     in_stack_fffffffffffffeb8))))))
              );
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
    ::
    async_wait<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>>
              ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                *)CONCAT17(in_stack_fffffffffffffec7,
                           CONCAT16(in_stack_fffffffffffffec6,
                                    CONCAT15(in_stack_fffffffffffffec5,
                                             CONCAT14(in_stack_fffffffffffffec4,
                                                      CONCAT13(in_stack_fffffffffffffec3,
                                                               CONCAT12(in_stack_fffffffffffffec2,
                                                                        CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
               (_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>
                *)CONCAT17(in_stack_fffffffffffffebf,
                           CONCAT16(in_stack_fffffffffffffebe,
                                    CONCAT15(in_stack_fffffffffffffebd,
                                             CONCAT14(in_stack_fffffffffffffebc,
                                                      CONCAT13(in_stack_fffffffffffffebb,
                                                               CONCAT12(in_stack_fffffffffffffeba,
                                                                        in_stack_fffffffffffffeb8)))
                                            ))));
  }
  local_b1[0] = '\0';
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,
                               CONCAT15(in_stack_fffffffffffffec5,
                                        CONCAT14(in_stack_fffffffffffffec4,
                                                 CONCAT13(in_stack_fffffffffffffec3,
                                                          CONCAT12(in_stack_fffffffffffffec2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))),
             (mutex_type *)
             CONCAT17(in_stack_fffffffffffffebf,
                      CONCAT16(in_stack_fffffffffffffebe,
                               CONCAT15(in_stack_fffffffffffffebd,
                                        CONCAT14(in_stack_fffffffffffffebc,
                                                 CONCAT13(in_stack_fffffffffffffebb,
                                                          CONCAT12(in_stack_fffffffffffffeba,
                                                                   in_stack_fffffffffffffeb8)))))));
  pcVar4 = (char *)(in_RDI + 0xe8);
  pcVar5 = local_b1;
  local_31 = 2;
  local_38 = 5;
  local_30 = pcVar5;
  local_28 = pcVar4;
  local_1c = std::__cmpexch_failure_order
                       (CONCAT13(in_stack_fffffffffffffec7,
                                 CONCAT12(in_stack_fffffffffffffec6,
                                          CONCAT11(in_stack_fffffffffffffec5,
                                                   in_stack_fffffffffffffec4))));
  local_11 = 2;
  local_18 = 5;
  local_1d = 2;
  local_10 = pcVar5;
  local_8 = pcVar4;
  switch(0x3b9ea5) {
  default:
    if (local_1c - memory_order_consume < 2) {
      cVar1 = *pcVar5;
      LOCK();
      cVar2 = *pcVar4;
      local_1e = cVar1 == cVar2;
      if (local_1e) {
        *pcVar4 = '\x02';
        cVar2 = cVar1;
      }
      UNLOCK();
      if (!local_1e) {
        *pcVar5 = cVar2;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      cVar1 = *pcVar5;
      LOCK();
      cVar2 = *pcVar4;
      local_1e = cVar1 == cVar2;
      if (local_1e) {
        *pcVar4 = '\x02';
        cVar2 = cVar1;
      }
      UNLOCK();
      if (!local_1e) {
        *pcVar5 = cVar2;
      }
    }
    else {
      cVar1 = *pcVar5;
      LOCK();
      cVar2 = *pcVar4;
      local_1e = cVar1 == cVar2;
      if (local_1e) {
        *pcVar4 = '\x02';
        cVar2 = cVar1;
      }
      UNLOCK();
      if (!local_1e) {
        *pcVar5 = cVar2;
      }
    }
    break;
  case 2:
    if (local_1c - memory_order_consume < 2) {
      cVar1 = *pcVar5;
      LOCK();
      cVar2 = *pcVar4;
      local_1e = cVar1 == cVar2;
      if (local_1e) {
        *pcVar4 = '\x02';
        cVar2 = cVar1;
      }
      UNLOCK();
      if (!local_1e) {
        *pcVar5 = cVar2;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      cVar2 = *pcVar5;
      LOCK();
      in_stack_fffffffffffffec7 = *pcVar4;
      in_stack_fffffffffffffec6 = cVar2 == in_stack_fffffffffffffec7;
      if ((bool)in_stack_fffffffffffffec6) {
        *pcVar4 = '\x02';
        in_stack_fffffffffffffec7 = cVar2;
      }
      UNLOCK();
      local_1e = (bool)in_stack_fffffffffffffec6;
      if (!(bool)in_stack_fffffffffffffec6) {
        *pcVar5 = in_stack_fffffffffffffec7;
        local_1e = (bool)in_stack_fffffffffffffec6;
      }
    }
    else {
      cVar1 = *pcVar5;
      LOCK();
      cVar2 = *pcVar4;
      local_1e = cVar1 == cVar2;
      if (local_1e) {
        *pcVar4 = '\x02';
        cVar2 = cVar1;
      }
      UNLOCK();
      if (!local_1e) {
        *pcVar5 = cVar2;
      }
    }
    break;
  case 3:
    if (local_1c - memory_order_consume < 2) {
      cVar2 = *pcVar5;
      LOCK();
      in_stack_fffffffffffffec3 = *pcVar4;
      in_stack_fffffffffffffec2 = cVar2 == in_stack_fffffffffffffec3;
      if ((bool)in_stack_fffffffffffffec2) {
        *pcVar4 = '\x02';
        in_stack_fffffffffffffec3 = cVar2;
      }
      UNLOCK();
      local_1e = (bool)in_stack_fffffffffffffec2;
      if (!(bool)in_stack_fffffffffffffec2) {
        *pcVar5 = in_stack_fffffffffffffec3;
        local_1e = (bool)in_stack_fffffffffffffec2;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      cVar2 = *pcVar5;
      LOCK();
      in_stack_fffffffffffffec1 = *pcVar4;
      in_stack_fffffffffffffec0 = cVar2 == in_stack_fffffffffffffec1;
      if ((bool)in_stack_fffffffffffffec0) {
        *pcVar4 = '\x02';
        in_stack_fffffffffffffec1 = cVar2;
      }
      UNLOCK();
      local_1e = (bool)in_stack_fffffffffffffec0;
      if (!(bool)in_stack_fffffffffffffec0) {
        *pcVar5 = in_stack_fffffffffffffec1;
        local_1e = (bool)in_stack_fffffffffffffec0;
      }
    }
    else {
      cVar2 = *pcVar5;
      LOCK();
      in_stack_fffffffffffffec5 = *pcVar4;
      in_stack_fffffffffffffec4 = cVar2 == in_stack_fffffffffffffec5;
      if ((bool)in_stack_fffffffffffffec4) {
        *pcVar4 = '\x02';
        in_stack_fffffffffffffec5 = cVar2;
      }
      UNLOCK();
      local_1e = (bool)in_stack_fffffffffffffec4;
      if (!(bool)in_stack_fffffffffffffec4) {
        *pcVar5 = in_stack_fffffffffffffec5;
        local_1e = (bool)in_stack_fffffffffffffec4;
      }
    }
    break;
  case 4:
    if (local_1c - memory_order_consume < 2) {
      cVar1 = *pcVar5;
      LOCK();
      cVar2 = *pcVar4;
      local_1e = cVar1 == cVar2;
      if (local_1e) {
        *pcVar4 = '\x02';
        cVar2 = cVar1;
      }
      UNLOCK();
      if (!local_1e) {
        *pcVar5 = cVar2;
      }
    }
    else if (local_1c == memory_order_seq_cst) {
      cVar1 = *pcVar5;
      LOCK();
      cVar2 = *pcVar4;
      local_1e = cVar1 == cVar2;
      if (local_1e) {
        *pcVar4 = '\x02';
        cVar2 = cVar1;
      }
      UNLOCK();
      if (!local_1e) {
        *pcVar5 = cVar2;
      }
    }
    else {
      cVar1 = *pcVar5;
      LOCK();
      cVar2 = *pcVar4;
      local_1e = cVar1 == cVar2;
      if (local_1e) {
        *pcVar4 = '\x02';
        cVar2 = cVar1;
      }
      UNLOCK();
      if (!local_1e) {
        *pcVar5 = cVar2;
      }
    }
  }
  if (local_1e == false) {
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,
                               CONCAT15(in_stack_fffffffffffffec5,
                                        CONCAT14(in_stack_fffffffffffffec4,
                                                 CONCAT13(in_stack_fffffffffffffec3,
                                                          CONCAT12(in_stack_fffffffffffffec2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffec1,
                                                  in_stack_fffffffffffffec0))))))));
  return;
}

Assistant:

void asio_service_impl::timer_handler(ERROR_CODE err) {
    if (continue_.load() == 1) {
        asio_timer_.expires_after
            ( std::chrono::duration_cast<std::chrono::nanoseconds>
              ( std::chrono::hours(1000) ) );
        asio_timer_.async_wait
            ( std::bind( &asio_service_impl::timer_handler,
                         this,
                         std::placeholders::_1 ) );
    }

    uint8_t exp = 0;
    std::unique_lock<std::mutex> lock(stopping_lock_);
    if (stopping_status_.compare_exchange_strong(exp, 2)) {
        // 0 means that stop() is not waiting for CV now.
        // make it 2, to avoid stop() waits for CV.
    } else {
        stopping_cv_.notify_all();
    }
}